

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_rev_p_aarch64(void *vd,void *vn,uint32_t pred_desc)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint64_t uVar6;
  long lVar7;
  uint64_t uVar8;
  uint8_t h_1;
  uint8_t l_2;
  intptr_t ih_1;
  intptr_t il;
  uint64_t h;
  uint64_t l_1;
  intptr_t ih;
  uint64_t l;
  intptr_t oprsz_2;
  intptr_t i;
  int esz;
  intptr_t oprsz;
  uint32_t pred_desc_local;
  void *vn_local;
  void *vd_local;
  
  uVar3 = extract32(pred_desc,0,5);
  uVar4 = uVar3 + 2;
  uVar5 = (ulong)uVar4;
  uVar3 = extract32(pred_desc,10,2);
  if (uVar5 < 9) {
    uVar6 = reverse_bits_64(*vn << ((char)uVar4 * -8 + 0x40U & 0x3f),uVar3);
    *(uint64_t *)vd = uVar6;
  }
  else if ((uVar4 & 0xf) == 0) {
    for (oprsz_2 = 0; oprsz_2 < (long)(uVar5 / 2); oprsz_2 = oprsz_2 + 8) {
      lVar7 = (uVar5 - 8) - oprsz_2;
      uVar6 = reverse_bits_64(*(uint64_t *)((long)vn + oprsz_2),uVar3);
      uVar8 = reverse_bits_64(*(uint64_t *)((long)vn + lVar7),uVar3);
      *(uint64_t *)((long)vd + oprsz_2) = uVar8;
      *(uint64_t *)((long)vd + lVar7) = uVar6;
    }
  }
  else {
    for (oprsz_2 = 0; oprsz_2 < (long)(uVar5 / 2); oprsz_2 = oprsz_2 + 1) {
      lVar7 = (uVar5 - 1) - oprsz_2;
      uVar1 = reverse_bits_8(*(uint8_t *)((long)vn + oprsz_2),uVar3);
      uVar2 = reverse_bits_8(*(uint8_t *)((long)vn + lVar7),uVar3);
      *(uint8_t *)((long)vd + oprsz_2) = uVar2;
      *(uint8_t *)((long)vd + lVar7) = uVar1;
    }
  }
  return;
}

Assistant:

void HELPER(sve_rev_p)(void *vd, void *vn, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    int esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    intptr_t i, oprsz_2 = oprsz / 2;

    if (oprsz <= 8) {
        uint64_t l = *(uint64_t *)vn;
        l = reverse_bits_64(l << (64 - 8 * oprsz), esz);
        *(uint64_t *)vd = l;
    } else if ((oprsz & 15) == 0) {
        for (i = 0; i < oprsz_2; i += 8) {
            intptr_t ih = oprsz - 8 - i;
            uint64_t l = reverse_bits_64(*(uint64_t *)((char *)vn + i), esz);
            uint64_t h = reverse_bits_64(*(uint64_t *)((char *)vn + ih), esz);
            *(uint64_t *)((char *)vd + i) = h;
            *(uint64_t *)((char *)vd + ih) = l;
        }
    } else {
        for (i = 0; i < oprsz_2; i += 1) {
            intptr_t il = H1(i);
            intptr_t ih = H1(oprsz - 1 - i);
            uint8_t l = reverse_bits_8(*(uint8_t *)((char *)vn + il), esz);
            uint8_t h = reverse_bits_8(*(uint8_t *)((char *)vn + ih), esz);
            *(uint8_t *)((char *)vd + il) = h;
            *(uint8_t *)((char *)vd + ih) = l;
        }
    }
}